

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O2

Relations dg::vr::RelationsAnalyzer::getCommon<unsigned_long,llvm::Value_const*>
                    (VRLocation *location,unsigned_long *lt,Relations known,Value **rt)

{
  pointer ppVVar1;
  Relations RVar2;
  pointer ppVVar3;
  
  ppVVar3 = (location->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (location->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppVVar3 == ppVVar1) {
      return (Relations)(_WordT)known.bits.super__Base_bitset<1UL>._M_w;
    }
    RVar2 = ValueRelations::between<unsigned_long,llvm::Value_const*>
                      (&(*ppVVar3)->source->relations,lt,rt);
    ppVVar3 = ppVVar3 + 1;
    known.bits.super__Base_bitset<1UL>._M_w =
         (bitset<12UL>)
         ((ulong)known.bits.super__Base_bitset<1UL>._M_w &
         (ulong)RVar2.bits.super__Base_bitset<1UL>._M_w);
  } while (known.bits.super__Base_bitset<1UL>._M_w != (_Base_bitset<1UL>)0x0);
  return (Relations)0;
}

Assistant:

static Relations getCommon(const VRLocation &location, const X &lt,
                               Relations known, const Y &rt) {
        for (VREdge *predEdge : location.predecessors) {
            const ValueRelations &predRels = predEdge->source->relations;
            known &= predRels.between(lt, rt);
            if (!known.any())
                return Relations();
        }
        return known;
    }